

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.c
# Opt level: O3

Variable * var_ht_get(VarHashTable *ht,VarHTItemKey key)

{
  uint32_t uVar1;
  int iVar2;
  size_t length;
  VarHTItem *pVVar3;
  
  length = key.ident_length;
  uVar1 = hash_string(key.key_ident_string,length);
  pVVar3 = ht->buckets[ht->cap - 1 & uVar1];
  while( true ) {
    if (pVVar3 == (VarHTItem *)0x0) {
      return (Variable *)0x0;
    }
    if (((pVVar3->key).ident_length == length) &&
       (iVar2 = bcmp((pVVar3->key).key_ident_string,key.key_ident_string,length), iVar2 == 0))
    break;
    pVVar3 = pVVar3->next;
  }
  return &pVVar3->value;
}

Assistant:

Variable *var_ht_get(VarHashTable *ht, VarHTItemKey key) {
    uint32_t index = var_hash(key) & (ht->cap - 1);

    if (ht->buckets[index] != NULL) {
        Variable *value = find(ht->buckets[index], key);
        if (value) {
            return value;
        }
    }

    return NULL;
}